

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O0

bool __thiscall kws::Generator::CreateFooter(Generator *this,ostream *file)

{
  ostream *poVar1;
  ulong uVar2;
  string *filename;
  ostream *in_RSI;
  char *in_stack_00000378;
  allocator local_81;
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"<hr size=\"1\">");
  std::operator<<(local_10,"<table width=\"100%\" border=\"0\">");
  std::operator<<(local_10,"<tr>");
  poVar1 = std::operator<<(local_10,
                           "<td>Generated by <a href=\"https://public.kitware.com/KWStyle\">KWStyle</a> 1.0b on <i>"
                          );
  kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_(in_stack_00000378);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"</i></td>");
  std::__cxx11::string::~string(local_30);
  std::operator<<(local_10,"<td>");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<(local_10,"<div align=\"center\"><img src=\"images/");
    filename = (string *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,(char *)filename,&local_81);
    kwssys::SystemTools::GetFilenameName(filename);
    poVar1 = std::operator<<(poVar1,local_60);
    poVar1 = std::operator<<(poVar1,"\" height=\"49\" /></div>");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::operator<<(local_10,"</td>");
  std::operator<<(local_10,"<td>");
  std::operator<<(local_10,
                  "<div align=\"right\"><a href=\"http://www.kitware.com\">&copy; Kitware Inc.</a></div></td>"
                 );
  std::operator<<(local_10,"</tr>");
  std::operator<<(local_10,"</table>");
  std::operator<<(local_10,"<br />");
  poVar1 = std::operator<<(local_10,"</html>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool Generator::CreateFooter(std::ostream * file)
{
  *file << "<hr size=\"1\">";
  *file << R"(<table width="100%" border="0">)";
  *file << "<tr>";
  *file << "<td>Generated by <a href=\"https://public.kitware.com/KWStyle\">KWStyle</a> 1.0b on <i>" << kwssys::SystemTools::GetCurrentDateTime("%A %B,%d at %I:%M:%S%p") << "</i></td>";
  *file << "<td>";
  if (!m_KWStyleLogo.empty()) {
    *file << R"(<div align="center"><img src="images/)"
          << kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str())
          << R"(" height="49" /></div>)" << std::endl;
  }
  *file << "</td>";
  *file << "<td>";
  *file
      << R"(<div align="right"><a href="http://www.kitware.com">&copy; Kitware Inc.</a></div></td>)";
  *file << "</tr>";
  *file << "</table>";
  *file << "<br />";

  *file << "</html>" << std::endl;

  return true;
}